

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

opStatus __thiscall llvm::detail::IEEEFloat::divideSpecials(IEEEFloat *this,IEEEFloat *rhs)

{
  byte bVar1;
  opStatus oVar2;
  
  bVar1 = this->field_0x12;
  oVar2 = opOK;
  switch((rhs->field_0x12 & 7) + (bVar1 & 7) * '\x04') {
  case 0:
  case 0xf:
    makeNaN(this,false,false,(APInt *)0x0);
    oVar2 = opInvalidOp;
    break;
  case 1:
  case 9:
  case 0xd:
    this->field_0x12 = (bVar1 & 0xf8) + 1;
    copySignificand(this,rhs);
    bVar1 = this->field_0x12;
  case 4:
  case 5:
  case 6:
  case 7:
    bVar1 = bVar1 & 0xf7;
    goto LAB_0018e85e;
  case 2:
  case 3:
  case 10:
  case 0xc:
  case 0xe:
    break;
  case 8:
    bVar1 = bVar1 & 0xf8 | 3;
LAB_0018e85e:
    this->field_0x12 = bVar1;
    oVar2 = opOK;
    break;
  case 0xb:
    this->field_0x12 = bVar1 & 0xf8;
    oVar2 = opDivByZero;
    break;
  default:
    llvm_unreachable_internal
              ((char *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
               ,0x60f);
  }
  return oVar2;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::divideSpecials(const IEEEFloat &rhs) {
  switch (PackCategoriesIntoKey(category, rhs.category)) {
  default:
    llvm_unreachable(nullptr);

  case PackCategoriesIntoKey(fcZero, fcNaN):
  case PackCategoriesIntoKey(fcNormal, fcNaN):
  case PackCategoriesIntoKey(fcInfinity, fcNaN):
    category = fcNaN;
    copySignificand(rhs);
    LLVM_FALLTHROUGH;
  case PackCategoriesIntoKey(fcNaN, fcZero):
  case PackCategoriesIntoKey(fcNaN, fcNormal):
  case PackCategoriesIntoKey(fcNaN, fcInfinity):
  case PackCategoriesIntoKey(fcNaN, fcNaN):
    sign = false;
    LLVM_FALLTHROUGH;
  case PackCategoriesIntoKey(fcInfinity, fcZero):
  case PackCategoriesIntoKey(fcInfinity, fcNormal):
  case PackCategoriesIntoKey(fcZero, fcInfinity):
  case PackCategoriesIntoKey(fcZero, fcNormal):
    return opOK;

  case PackCategoriesIntoKey(fcNormal, fcInfinity):
    category = fcZero;
    return opOK;

  case PackCategoriesIntoKey(fcNormal, fcZero):
    category = fcInfinity;
    return opDivByZero;

  case PackCategoriesIntoKey(fcInfinity, fcInfinity):
  case PackCategoriesIntoKey(fcZero, fcZero):
    makeNaN();
    return opInvalidOp;

  case PackCategoriesIntoKey(fcNormal, fcNormal):
    return opOK;
  }
}